

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableHandler.hpp
# Opt level: O3

Waveform * __thiscall
trackerboy::TableHandler<trackerboy::Waveform,_1163280727U>::initItem
          (TableHandler<trackerboy::Waveform,_1163280727U> *this,InputBlock *block,
          Table<trackerboy::Waveform> *table)

{
  Waveform *pWVar1;
  InputBlock *block_00;
  uint8_t id;
  byte local_39;
  string local_38;
  
  InputBlock::read<char>(block,1,(char *)&local_39);
  pWVar1 = Table<trackerboy::Waveform>::operator[](table,(uint)local_39);
  if (pWVar1 == (Waveform *)0x0) {
    pWVar1 = Table<trackerboy::Waveform>::insert(table,(uint)local_39);
    deserializeString_abi_cxx11_(&local_38,(trackerboy *)block,block_00);
    Named::setName(&pWVar1->super_Named,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pWVar1 = (Waveform *)0x0;
  }
  return pWVar1;
}

Assistant:

T* initItem(InputBlock &block, Table<T> &table) {
        uint8_t id;
        block.read(id);

        if (table[id] != nullptr) {
            return nullptr;
        }

        auto item = table.insert(id);
        item->setName(deserializeString(block));
        return item;
    }